

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageMultisampleLoadStoreTests.cpp
# Opt level: O1

TestStatus *
vkt::image::anon_unknown_1::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  deInt32 *pdVar1;
  VkBool32 *this;
  Allocation *pAVar2;
  long *plVar3;
  SharedPtrStateBase *pSVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var5;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  CaseDef *pCVar6;
  pointer pSVar7;
  undefined8 pipelineLayout;
  VkDescriptorPool descriptorPool;
  undefined1 descriptorSetLayout [8];
  deUint32 dVar8;
  int iVar9;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  Image *pIVar10;
  VkDeviceSize VVar11;
  Buffer *pBVar12;
  long lVar13;
  TextureFormat format;
  DescriptorSetLayoutBuilder *pDVar14;
  DescriptorPoolBuilder *pDVar15;
  undefined8 *puVar16;
  long *plVar17;
  int *piVar18;
  Unique<vk::Handle<(vk::HandleType)22>_> *pUVar19;
  SharedPtrStateBase *pSVar20;
  const_iterator cVar21;
  DescriptorSetUpdateBuilder *pDVar22;
  NotSupportedError *this_00;
  bool bVar23;
  deUint32 numDescriptors;
  int iVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  VkDeviceSize bufferSize;
  deInt32 *pdVar28;
  uint uVar29;
  undefined4 *__s;
  VkExtent3D extent;
  IVec3 imageSize;
  undefined4 uStack_58c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  long local_578;
  CaseDef *local_570;
  VkBool32 local_568;
  VkBool32 VStack_564;
  VkBool32 VStack_560;
  VkBool32 VStack_55c;
  VkBool32 local_558;
  VkBool32 VStack_554;
  VkBool32 VStack_550;
  VkBool32 VStack_54c;
  VkDescriptorSetLayout local_540;
  IVec3 workSize;
  VkDescriptorSet descriptorSet_1;
  UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> checksumImage;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  allDescriptorSets;
  UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> resultBuffer;
  UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> msImage;
  VkDescriptorSet descriptorSet;
  VkDescriptorBufferInfo descriptorConstantsBufferInfo;
  VkDescriptorImageInfo descriptorMultiImageInfo;
  UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> constantsBuffer;
  VkPhysicalDeviceFeatures features;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  allMultisampledImageViews;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_2b0;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  allChecksumImageViews;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_270;
  undefined8 local_258;
  undefined8 uStack_250;
  deUint32 local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  deUint32 local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  deUint32 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  deUint32 local_200;
  VkCommandPool local_1f8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_1f0;
  VkDescriptorPool local_1d8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_1d0;
  undefined1 local_1b8 [8];
  Deleter<vk::Handle<(vk::HandleType)14>_> aDStack_1b0 [4];
  ios_base local_140 [272];
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  dVar8 = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  (*vki->_vptr_InstanceInterface[2])(vki,physDevice,&features);
  if (features.shaderStorageImageMultisample == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Multisampled storage images are not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
               ,0xb9);
  }
  else {
    iVar9 = (*vki->_vptr_InstanceInterface[4])
                      (vki,physDevice,(ulong)caseDef->format,1,0,8,0,local_1b8);
    if (iVar9 == -0xb) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Format is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
                 ,0xc0);
    }
    else {
      if ((caseDef->numSamples & ~aDStack_1b0[0].m_device._4_4_) == 0) {
        pIVar10 = (Image *)operator_new(0x30);
        local_570 = caseDef;
        makeImageCreateInfo((VkImageCreateInfo *)&features,&caseDef->texture,caseDef->format,8,0);
        Image::Image(pIVar10,vk,device,allocator,(VkImageCreateInfo *)&features,
                     (MemoryRequirement)0x0);
        msImage.super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.
        ptr = pIVar10;
        pIVar10 = (Image *)operator_new(0x30);
        Texture::Texture((Texture *)local_1b8,&local_570->texture,1);
        makeImageCreateInfo((VkImageCreateInfo *)&features,(Texture *)local_1b8,VK_FORMAT_R32_SINT,9
                            ,0);
        Image::Image(pIVar10,vk,device,allocator,(VkImageCreateInfo *)&features,
                     (MemoryRequirement)0x0);
        local_578 = (long)(local_570->texture).m_numLayers;
        checksumImage.super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.
        m_data.ptr = pIVar10;
        VVar11 = getOptimalUniformBufferChunkSize(vki,physDevice,4);
        pBVar12 = (Buffer *)operator_new(0x30);
        bufferSize = VVar11 * local_578;
        makeBufferCreateInfo((VkBufferCreateInfo *)&features,bufferSize,0x10);
        image::Buffer::Buffer
                  (pBVar12,vk,device,allocator,(VkBufferCreateInfo *)&features,
                   (MemoryRequirement)0x1);
        pAVar2 = (pBVar12->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        __s = (undefined4 *)pAVar2->m_hostPtr;
        constantsBuffer.
        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
             pBVar12;
        memset(__s,0,bufferSize);
        if (0 < (int)local_578) {
          lVar13 = 0;
          do {
            *__s = (int)lVar13;
            lVar13 = lVar13 + 1;
            __s = (undefined4 *)((long)__s + VVar11);
          } while (local_578 != lVar13);
        }
        ::vk::flushMappedMemoryRange
                  (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,
                   bufferSize);
        pCVar6 = local_570;
        Texture::size(&local_570->texture);
        format = ::vk::mapVkFormat(VK_FORMAT_R32_SINT);
        iVar9 = tcu::getPixelSize(format);
        iVar9 = iVar9 * features.robustBufferAccess * features.fullDrawIndexUint32 *
                features.imageCubeArray;
        pBVar12 = (Buffer *)operator_new(0x30);
        VVar11 = (VkDeviceSize)iVar9;
        makeBufferCreateInfo((VkBufferCreateInfo *)&features,VVar11,2);
        image::Buffer::Buffer
                  (pBVar12,vk,device,allocator,(VkBufferCreateInfo *)&features,
                   (MemoryRequirement)0x1);
        pAVar2 = (pBVar12->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        resultBuffer.super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
        m_data.ptr = pBVar12;
        memset(pAVar2->m_hostPtr,0,VVar11);
        ::vk::flushMappedMemoryRange
                  (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,VVar11);
        ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
                  ((DescriptorSetLayoutBuilder *)&features);
        lVar13 = local_578;
        pDVar14 = ::vk::DescriptorSetLayoutBuilder::addBinding
                            ((DescriptorSetLayoutBuilder *)&features,
                             VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1,0x20,(VkSampler *)0x0);
        pDVar14 = ::vk::DescriptorSetLayoutBuilder::addBinding
                            (pDVar14,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
        pDVar14 = ::vk::DescriptorSetLayoutBuilder::addBinding
                            (pDVar14,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
        ::vk::DescriptorSetLayoutBuilder::build
                  ((Move<vk::Handle<(vk::HandleType)19>_> *)local_1b8,pDVar14,vk,device,0);
        descriptorSetLayout = local_1b8;
        DStack_270.m_device = aDStack_1b0[0].m_device;
        DStack_270.m_allocator = aDStack_1b0[0].m_allocator;
        DStack_270.m_deviceIface = aDStack_1b0[0].m_deviceIface;
        local_1b8 = (undefined1  [8])0x0;
        aDStack_1b0[0].m_deviceIface = (DeviceInterface *)0x0;
        aDStack_1b0[0].m_device = (VkDevice)0x0;
        aDStack_1b0[0].m_allocator = (VkAllocationCallbacks *)0x0;
        if (features._48_8_ != 0) {
          operator_delete((void *)features._48_8_,features._64_8_ - features._48_8_);
        }
        if (features._24_8_ != 0) {
          operator_delete((void *)features._24_8_,features._40_8_ - features._24_8_);
        }
        if (features._0_8_ != 0) {
          operator_delete((void *)features._0_8_,features._16_8_ - features._0_8_);
        }
        ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_1b8);
        numDescriptors = (deUint32)lVar13;
        pDVar15 = ::vk::DescriptorPoolBuilder::addType
                            ((DescriptorPoolBuilder *)local_1b8,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                             numDescriptors);
        pDVar15 = ::vk::DescriptorPoolBuilder::addType
                            (pDVar15,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,numDescriptors);
        pDVar15 = ::vk::DescriptorPoolBuilder::addType
                            (pDVar15,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,numDescriptors);
        ::vk::DescriptorPoolBuilder::build
                  ((Move<vk::Handle<(vk::HandleType)21>_> *)&features,pDVar15,vk,device,1,
                   numDescriptors);
        DStack_1d0.m_device = (VkDevice)features._16_8_;
        DStack_1d0.m_allocator = (VkAllocationCallbacks *)features._24_8_;
        local_1d8.m_internal._0_4_ = features.robustBufferAccess;
        local_1d8.m_internal._4_4_ = features.fullDrawIndexUint32;
        DStack_1d0.m_deviceIface = (DeviceInterface *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        if (local_1b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1b8,(long)aDStack_1b0[0].m_device - (long)local_1b8);
        }
        descriptorPool.m_internal = local_1d8.m_internal;
        allDescriptorSets.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        allDescriptorSets.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        allDescriptorSets.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        allMultisampledImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        allMultisampledImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        allMultisampledImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        allChecksumImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        allChecksumImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        allChecksumImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_540.m_internal = (deUint64)descriptorSetLayout;
        bVar23 = pCVar6->singleLayerBind;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ::_M_erase_at_end(&allDescriptorSets,(pointer)0x0);
        if (bVar23 == true) {
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
          ::resize(&allDescriptorSets,(long)(pCVar6->texture).m_numLayers);
          if (0 < (pCVar6->texture).m_numLayers) {
            lVar25 = 8;
            lVar13 = 0;
            do {
              makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&features,vk,device,
                                descriptorPool,local_540);
              puVar16 = (undefined8 *)operator_new(0x20);
              puVar16[2] = features._16_8_;
              puVar16[3] = features._24_8_;
              *puVar16 = features._0_8_;
              puVar16[1] = features._8_8_;
              features.robustBufferAccess = 0;
              features.fullDrawIndexUint32 = 0;
              features.imageCubeArray = 0;
              features.independentBlend = 0;
              features.geometryShader = 0;
              features.tessellationShader = 0;
              features.sampleRateShading = 0;
              features.dualSrcBlend = 0;
              plVar17 = (long *)operator_new(0x20);
              pSVar7 = allDescriptorSets.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(undefined4 *)(plVar17 + 1) = 0;
              *(undefined4 *)((long)plVar17 + 0xc) = 0;
              *plVar17 = (long)&PTR__SharedPtrState_00d53860;
              plVar17[2] = (long)puVar16;
              *(undefined4 *)(plVar17 + 1) = 1;
              *(undefined4 *)((long)plVar17 + 0xc) = 1;
              plVar3 = *(long **)((long)&(allDescriptorSets.
                                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar25
                                 );
              if (plVar3 != plVar17) {
                if (plVar3 != (long *)0x0) {
                  LOCK();
                  plVar3 = plVar3 + 1;
                  *(int *)plVar3 = (int)*plVar3 + -1;
                  UNLOCK();
                  if ((int)*plVar3 == 0) {
                    *(undefined8 *)
                     ((long)allDescriptorSets.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar25 + -8) = 0;
                    (**(code **)(**(long **)((long)&(allDescriptorSets.
                                                                                                          
                                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr
                                            + lVar25) + 0x10))();
                  }
                  LOCK();
                  piVar18 = (int *)(*(long *)((long)&pSVar7->m_ptr + lVar25) + 0xc);
                  *piVar18 = *piVar18 + -1;
                  UNLOCK();
                  if (*piVar18 == 0) {
                    plVar3 = *(long **)((long)&pSVar7->m_ptr + lVar25);
                    if (plVar3 != (long *)0x0) {
                      (**(code **)(*plVar3 + 8))();
                    }
                    *(undefined8 *)((long)&pSVar7->m_ptr + lVar25) = 0;
                  }
                }
                *(undefined8 **)((long)pSVar7 + lVar25 + -8) = puVar16;
                *(long **)((long)&pSVar7->m_ptr + lVar25) = plVar17;
                LOCK();
                *(int *)(plVar17 + 1) = (int)plVar17[1] + 1;
                UNLOCK();
                LOCK();
                piVar18 = (int *)(*(long *)((long)&pSVar7->m_ptr + lVar25) + 0xc);
                *piVar18 = *piVar18 + 1;
                UNLOCK();
              }
              plVar3 = plVar17 + 1;
              LOCK();
              *(int *)plVar3 = (int)*plVar3 + -1;
              UNLOCK();
              if ((int)*plVar3 == 0) {
                (**(code **)(*plVar17 + 0x10))(plVar17);
              }
              piVar18 = (int *)((long)plVar17 + 0xc);
              LOCK();
              *piVar18 = *piVar18 + -1;
              UNLOCK();
              if (*piVar18 == 0) {
                (**(code **)(*plVar17 + 8))(plVar17);
              }
              if (features._0_8_ != 0) {
                local_1b8._0_4_ = features.robustBufferAccess;
                local_1b8._4_4_ = features.fullDrawIndexUint32;
                (**(code **)(*(long *)features._8_8_ + 0x1e8))
                          (features._8_8_,features._16_8_,features._24_8_,1,local_1b8);
              }
              features.geometryShader = 0;
              features.tessellationShader = 0;
              features.sampleRateShading = 0;
              features.dualSrcBlend = 0;
              features.robustBufferAccess = 0;
              features.fullDrawIndexUint32 = 0;
              features.imageCubeArray = 0;
              features.independentBlend = 0;
              lVar13 = lVar13 + 1;
              lVar25 = lVar25 + 0x10;
            } while (lVar13 < (local_570->texture).m_numLayers);
          }
        }
        else {
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
          ::resize(&allDescriptorSets,1);
          makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&features,vk,device,
                            descriptorPool,local_540);
          pUVar19 = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
          (pUVar19->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
               (VkDevice)features._16_8_;
          (pUVar19->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal
               = features._24_8_;
          (pUVar19->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
               features._0_8_;
          (pUVar19->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
               (DeviceInterface *)features._8_8_;
          features.robustBufferAccess = 0;
          features.fullDrawIndexUint32 = 0;
          features.imageCubeArray = 0;
          features.independentBlend = 0;
          features.geometryShader = 0;
          features.tessellationShader = 0;
          features.sampleRateShading = 0;
          features.dualSrcBlend = 0;
          pSVar20 = (SharedPtrStateBase *)operator_new(0x20);
          pSVar7 = allDescriptorSets.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar1 = &pSVar20->strongRefCount;
          pSVar20->strongRefCount = 0;
          pSVar20->weakRefCount = 0;
          pSVar20->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d53860;
          pSVar20[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar19;
          pSVar20->strongRefCount = 1;
          pSVar20->weakRefCount = 1;
          pSVar4 = (allDescriptorSets.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_state;
          if (pSVar4 != pSVar20) {
            if (pSVar4 != (SharedPtrStateBase *)0x0) {
              LOCK();
              pdVar28 = &pSVar4->strongRefCount;
              *pdVar28 = *pdVar28 + -1;
              UNLOCK();
              if (*pdVar28 == 0) {
                (allDescriptorSets.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr =
                     (Unique<vk::Handle<(vk::HandleType)22>_> *)0x0;
                (*(allDescriptorSets.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_state->_vptr_SharedPtrStateBase[2])
                          ();
              }
              LOCK();
              pdVar28 = &pSVar7->m_state->weakRefCount;
              *pdVar28 = *pdVar28 + -1;
              UNLOCK();
              if (*pdVar28 == 0) {
                if (pSVar7->m_state != (SharedPtrStateBase *)0x0) {
                  (*pSVar7->m_state->_vptr_SharedPtrStateBase[1])();
                }
                pSVar7->m_state = (SharedPtrStateBase *)0x0;
              }
            }
            pSVar7->m_ptr = pUVar19;
            pSVar7->m_state = pSVar20;
            LOCK();
            pSVar20->strongRefCount = pSVar20->strongRefCount + 1;
            UNLOCK();
            LOCK();
            pdVar28 = &pSVar7->m_state->weakRefCount;
            *pdVar28 = *pdVar28 + 1;
            UNLOCK();
          }
          pdVar28 = &pSVar20->weakRefCount;
          LOCK();
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            (*pSVar20->_vptr_SharedPtrStateBase[2])(pSVar20);
          }
          LOCK();
          *pdVar28 = *pdVar28 + -1;
          UNLOCK();
          if (*pdVar28 == 0) {
            (*pSVar20->_vptr_SharedPtrStateBase[1])(pSVar20);
          }
          if (features._0_8_ != 0) {
            local_1b8._0_4_ = features.robustBufferAccess;
            local_1b8._4_4_ = features.fullDrawIndexUint32;
            (**(code **)(*(long *)features._8_8_ + 0x1e8))
                      (features._8_8_,features._16_8_,features._24_8_,1);
          }
          features.geometryShader = 0;
          features.tessellationShader = 0;
          features.sampleRateShading = 0;
          features.dualSrcBlend = 0;
          features.robustBufferAccess = 0;
          features.fullDrawIndexUint32 = 0;
          features.imageCubeArray = 0;
          features.independentBlend = 0;
        }
        pCVar6 = local_570;
        insertImageViews(vk,device,local_570,local_570->format,
                         (VkImage)((msImage.
                                    super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                                    .m_data.ptr)->m_image).
                                  super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                  m_internal,&allMultisampledImageViews);
        insertImageViews(vk,device,pCVar6,VK_FORMAT_R32_SINT,
                         (VkImage)((checksumImage.
                                    super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                                    .m_data.ptr)->m_image).
                                  super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                  m_internal,&allChecksumImageViews);
        makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&features,vk,device,
                           (VkDescriptorSetLayout)descriptorSetLayout);
        pipelineLayout = features._0_8_;
        DStack_2b0.m_device = (VkDevice)features._16_8_;
        DStack_2b0.m_allocator = (VkAllocationCallbacks *)features._24_8_;
        DStack_2b0.m_deviceIface = (DeviceInterface *)features._8_8_;
        ::vk::createCommandPool
                  ((Move<vk::Handle<(vk::HandleType)24>_> *)&features,vk,device,2,dVar8,
                   (VkAllocationCallbacks *)0x0);
        DStack_1f0.m_device = (VkDevice)features._16_8_;
        DStack_1f0.m_allocator = (VkAllocationCallbacks *)features._24_8_;
        local_1f8.m_internal._0_4_ = features.robustBufferAccess;
        local_1f8.m_internal._4_4_ = features.fullDrawIndexUint32;
        DStack_1f0.m_deviceIface = (DeviceInterface *)features._8_8_;
        ::vk::allocateCommandBuffer
                  ((Move<vk::VkCommandBuffer_s_*> *)&features,vk,device,
                   (VkCommandPool)features._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
        local_558 = features.geometryShader;
        VStack_554 = features.tessellationShader;
        VStack_550 = features.sampleRateShading;
        VStack_54c = features.dualSrcBlend;
        local_568 = features.robustBufferAccess;
        VStack_564 = features.fullDrawIndexUint32;
        VStack_560 = features.imageCubeArray;
        VStack_55c = features.independentBlend;
        if (pCVar6->singleLayerBind == true) {
          workSize.m_data[2] = (pCVar6->texture).m_layerSize.m_data[2];
          workSize.m_data._0_8_ = *(undefined8 *)(pCVar6->texture).m_layerSize.m_data;
        }
        else {
          Texture::size(&pCVar6->texture);
        }
        uVar29 = 1;
        if (pCVar6->singleLayerBind != false) {
          uVar29 = (uint)local_578;
        }
        dVar8 = (pCVar6->texture).m_numLayers;
        p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)context->m_progCollection;
        imageSize.m_data._0_8_ = &local_588;
        std::__cxx11::string::_M_construct<char_const*>((string *)&imageSize,"comp_store","");
        cVar21 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                 ::find(p_Var5,(key_type *)&imageSize);
        ::vk::createShaderModule
                  ((Move<vk::Handle<(vk::HandleType)14>_> *)&features,vk,device,
                   *(ProgramBinary **)(cVar21._M_node + 2),0);
        aDStack_1b0[0].m_device = (VkDevice)features._16_8_;
        aDStack_1b0[0].m_allocator = (VkAllocationCallbacks *)features._24_8_;
        local_1b8._0_4_ = features.robustBufferAccess;
        local_1b8._4_4_ = features.fullDrawIndexUint32;
        aDStack_1b0[0].m_deviceIface = (DeviceInterface *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)imageSize.m_data._0_8_ != &local_588) {
          operator_delete((void *)imageSize.m_data._0_8_,local_588._M_allocated_capacity + 1);
        }
        makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&features,vk,device,
                            (VkPipelineLayout)pipelineLayout,(VkShaderModule)local_1b8);
        local_588._M_allocated_capacity._0_4_ = features.geometryShader;
        local_588._M_allocated_capacity._4_4_ = features.tessellationShader;
        local_588._8_4_ = features.sampleRateShading;
        local_588._12_4_ = features.dualSrcBlend;
        imageSize.m_data[0] = features.robustBufferAccess;
        imageSize.m_data[1] = features.fullDrawIndexUint32;
        imageSize.m_data[2] = features.imageCubeArray;
        uStack_58c = features.independentBlend;
        beginCommandBuffer(vk,(VkCommandBuffer)CONCAT44(VStack_564,local_568));
        (*vk->_vptr_DeviceInterface[0x4c])(vk,CONCAT44(VStack_564,local_568),1);
        local_210 = 1;
        uStack_208 = 1;
        subresourceRange.levelCount = 1;
        subresourceRange.baseArrayLayer = 0;
        subresourceRange.aspectMask = 1;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.layerCount = dVar8;
        local_200 = dVar8;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
                   VK_IMAGE_LAYOUT_GENERAL,
                   (VkImage)((msImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange);
        local_228 = 1;
        uStack_220 = 1;
        subresourceRange_00.levelCount = 1;
        subresourceRange_00.baseArrayLayer = 0;
        subresourceRange_00.aspectMask = 1;
        subresourceRange_00.baseMipLevel = 0;
        subresourceRange_00.layerCount = dVar8;
        local_218 = dVar8;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features.multiViewport,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
                   VK_IMAGE_LAYOUT_GENERAL,
                   (VkImage)((checksumImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange_00);
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,CONCAT44(VStack_564,local_568),1,0x800,0,0,0,0,0,2,(int)&features);
        local_540.m_internal._0_4_ = dVar8;
        local_578 = CONCAT44(local_578._4_4_,uVar29);
        if (0 < (int)uVar29) {
          lVar13 = 0;
          do {
            descriptorSet.m_internal =
                 **(deUint64 **)
                   ((long)&(allDescriptorSets.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13);
            ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
                      ((DescriptorSetUpdateBuilder *)&features);
            pDVar22 = (DescriptorSetUpdateBuilder *)
                      ::vk::DescriptorSetUpdateBuilder::write
                                ((DescriptorSetUpdateBuilder *)&features,
                                 (int)descriptorSet.m_internal,(void *)0x0,0);
            pDVar22 = (DescriptorSetUpdateBuilder *)
                      ::vk::DescriptorSetUpdateBuilder::write
                                (pDVar22,(int)descriptorSet.m_internal,&DAT_00000001,0);
            ::vk::DescriptorSetUpdateBuilder::update(pDVar22,vk,device);
            if (features._48_8_ != 0) {
              operator_delete((void *)features._48_8_,features._64_8_ - features._48_8_);
            }
            if (features._24_8_ != 0) {
              operator_delete((void *)features._24_8_,features._40_8_ - features._24_8_);
            }
            std::
            vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
            ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
                       *)&features);
            (*vk->_vptr_DeviceInterface[0x56])
                      (vk,CONCAT44(VStack_564,local_568),1,pipelineLayout,0,1,&descriptorSet,0,0);
            (*vk->_vptr_DeviceInterface[0x5d])
                      (vk,CONCAT44(VStack_564,local_568),workSize.m_data._0_8_ & 0xffffffff,
                       (ulong)workSize.m_data._0_8_ >> 0x20);
            lVar13 = lVar13 + 0x10;
          } while ((ulong)uVar29 << 4 != lVar13);
        }
        endCommandBuffer(vk,(VkCommandBuffer)CONCAT44(VStack_564,local_568));
        dVar8 = (deUint32)local_540.m_internal;
        iVar9 = (uint)local_578;
        submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)CONCAT44(VStack_564,local_568));
        if (imageSize.m_data._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(imageSize.m_data + 2),
                     (VkPipeline)imageSize.m_data._0_8_);
        }
        if (local_1b8 != (undefined1  [8])0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                    (aDStack_1b0,(VkShaderModule)local_1b8);
        }
        p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)context->m_progCollection;
        imageSize.m_data._0_8_ = &local_588;
        std::__cxx11::string::_M_construct<char_const*>((string *)&imageSize,"comp_load","");
        cVar21 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                 ::find(p_Var5,(key_type *)&imageSize);
        ::vk::createShaderModule
                  ((Move<vk::Handle<(vk::HandleType)14>_> *)&features,vk,device,
                   *(ProgramBinary **)(cVar21._M_node + 2),0);
        aDStack_1b0[0].m_device = (VkDevice)features._16_8_;
        aDStack_1b0[0].m_allocator = (VkAllocationCallbacks *)features._24_8_;
        local_1b8._0_4_ = features.robustBufferAccess;
        local_1b8._4_4_ = features.fullDrawIndexUint32;
        aDStack_1b0[0].m_deviceIface = (DeviceInterface *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)imageSize.m_data._0_8_ != &local_588) {
          operator_delete((void *)imageSize.m_data._0_8_,local_588._M_allocated_capacity + 1);
        }
        makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&features,vk,device,
                            (VkPipelineLayout)pipelineLayout,(VkShaderModule)local_1b8);
        local_588._M_allocated_capacity._0_4_ = features.geometryShader;
        local_588._M_allocated_capacity._4_4_ = features.tessellationShader;
        local_588._8_4_ = features.sampleRateShading;
        local_588._12_4_ = features.dualSrcBlend;
        imageSize.m_data[0] = features.robustBufferAccess;
        imageSize.m_data[1] = features.fullDrawIndexUint32;
        imageSize.m_data[2] = features.imageCubeArray;
        uStack_58c = features.independentBlend;
        beginCommandBuffer(vk,(VkCommandBuffer)CONCAT44(VStack_564,local_568));
        (*vk->_vptr_DeviceInterface[0x4c])
                  (vk,CONCAT44(VStack_564,local_568),1,imageSize.m_data._0_8_);
        local_240 = 1;
        uStack_238 = 1;
        local_230 = dVar8;
        subresourceRange_01.levelCount = 1;
        subresourceRange_01.baseArrayLayer = 0;
        subresourceRange_01.aspectMask = 1;
        subresourceRange_01.baseMipLevel = 0;
        subresourceRange_01.layerCount = dVar8;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features,0x40,0x20,VK_IMAGE_LAYOUT_GENERAL,
                   VK_IMAGE_LAYOUT_GENERAL,
                   (VkImage)((msImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange_01);
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,CONCAT44(VStack_564,local_568),0x800,0x800,0,0,0,0,0,1,(int)&features);
        if (0 < iVar9) {
          lVar13 = 0;
          do {
            descriptorSet_1.m_internal =
                 **(deUint64 **)
                   ((long)&(allDescriptorSets.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13);
            descriptorSet.m_internal =
                 ((constantsBuffer.
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                 object.m_internal;
            ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
                      ((DescriptorSetUpdateBuilder *)&features);
            pDVar22 = (DescriptorSetUpdateBuilder *)
                      ::vk::DescriptorSetUpdateBuilder::write
                                ((DescriptorSetUpdateBuilder *)&features,
                                 (int)descriptorSet_1.m_internal,(void *)0x0,0);
            pDVar22 = (DescriptorSetUpdateBuilder *)
                      ::vk::DescriptorSetUpdateBuilder::write
                                (pDVar22,(int)descriptorSet_1.m_internal,&DAT_00000001,0);
            pDVar22 = (DescriptorSetUpdateBuilder *)
                      ::vk::DescriptorSetUpdateBuilder::write
                                (pDVar22,(int)descriptorSet_1.m_internal,(void *)0x2,0);
            ::vk::DescriptorSetUpdateBuilder::update(pDVar22,vk,device);
            if (features._48_8_ != 0) {
              operator_delete((void *)features._48_8_,features._64_8_ - features._48_8_);
            }
            if (features._24_8_ != 0) {
              operator_delete((void *)features._24_8_,features._40_8_ - features._24_8_);
            }
            std::
            vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
            ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
                       *)&features);
            (*vk->_vptr_DeviceInterface[0x56])
                      (vk,CONCAT44(VStack_564,local_568),1,pipelineLayout,0,1,&descriptorSet_1,0,0);
            (*vk->_vptr_DeviceInterface[0x5d])
                      (vk,CONCAT44(VStack_564,local_568),workSize.m_data._0_8_ & 0xffffffff,
                       (ulong)workSize.m_data._0_8_ >> 0x20,(ulong)(uint)workSize.m_data[2]);
            lVar13 = lVar13 + 0x10;
          } while ((ulong)uVar29 << 4 != lVar13);
        }
        endCommandBuffer(vk,(VkCommandBuffer)CONCAT44(VStack_564,local_568));
        pCVar6 = local_570;
        dVar8 = (deUint32)local_540.m_internal;
        submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)CONCAT44(VStack_564,local_568));
        if (imageSize.m_data._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(imageSize.m_data + 2),
                     (VkPipeline)imageSize.m_data._0_8_);
        }
        if (local_1b8 != (undefined1  [8])0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                    (aDStack_1b0,(VkShaderModule)local_1b8);
        }
        beginCommandBuffer(vk,(VkCommandBuffer)CONCAT44(VStack_564,local_568));
        local_258 = 1;
        uStack_250 = 1;
        local_248 = dVar8;
        subresourceRange_02.levelCount = 1;
        subresourceRange_02.baseArrayLayer = 0;
        subresourceRange_02.aspectMask = 1;
        subresourceRange_02.baseMipLevel = 0;
        subresourceRange_02.layerCount = dVar8;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
                   VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                   (VkImage)((checksumImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange_02);
        dVar8 = 0;
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,CONCAT44(VStack_564,local_568),0x800,0x1000,0,0,0,0,0,1,(int)&features);
        extent.height = 0;
        extent.width = (pCVar6->texture).m_layerSize.m_data[2];
        extent.depth = (pCVar6->texture).m_numLayers;
        makeBufferImageCopy((VkBufferImageCopy *)&features,
                            *(image **)(pCVar6->texture).m_layerSize.m_data,extent,dVar8);
        (*vk->_vptr_DeviceInterface[99])
                  (vk,CONCAT44(VStack_564,local_568),
                   ((checksumImage.
                     super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.
                     m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                   object.m_internal,6,
                   ((resultBuffer.
                     super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                     m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                   object.m_internal,1,(int)&features);
        makeBufferMemoryBarrier
                  ((VkBufferMemoryBarrier *)&features,0x1000,0x2000,
                   (VkBuffer)
                   ((resultBuffer.
                     super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                     m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                   object.m_internal,0,VVar11);
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,CONCAT44(VStack_564,local_568),0x1000,0x4000,0,0,0,1,&features,0,0);
        endCommandBuffer(vk,(VkCommandBuffer)CONCAT44(VStack_564,local_568));
        submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)CONCAT44(VStack_564,local_568));
        pAVar2 = ((resultBuffer.
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        ::vk::invalidateMappedMemoryRange
                  (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,VVar11);
        Texture::size(&pCVar6->texture);
        if (0 < imageSize.m_data[2]) {
          iVar9 = (pCVar6->texture).m_numSamples;
          piVar18 = (int *)pAVar2->m_hostPtr;
          iVar26 = 0;
          do {
            bVar23 = 0 < imageSize.m_data[1];
            if (0 < imageSize.m_data[1]) {
              iVar27 = 0;
              do {
                if (0 < imageSize.m_data[0]) {
                  iVar24 = 0;
                  do {
                    if (*piVar18 != iVar9) {
                      local_1b8 = (undefined1  [8])context->m_testCtx->m_log;
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_1b0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)aDStack_1b0,
                                 "Some sample colors were incorrect at (x, y, layer) = (",0x36);
                      std::ostream::operator<<(aDStack_1b0,iVar24);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)aDStack_1b0,", ",2);
                      std::ostream::operator<<(aDStack_1b0,iVar27);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)aDStack_1b0,", ",2);
                      std::ostream::operator<<(aDStack_1b0,iVar26);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)aDStack_1b0,")",1);
                      features._0_8_ =
                           tcu::MessageBuilder::operator<<
                                     ((MessageBuilder *)local_1b8,
                                      (EndMessageToken *)&tcu::TestLog::EndMessage);
                      std::__cxx11::ostringstream::ostringstream
                                ((ostringstream *)&features.imageCubeArray);
                      this = &features.imageCubeArray;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this,"Checksum value is ",0x12);
                      std::ostream::operator<<(this,*piVar18);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this," but expected ",0xe);
                      std::ostream::operator<<(this,iVar9);
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)&features,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
                      std::ios_base::~ios_base((ios_base *)&features.shaderStorageImageMultisample);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_1b0);
                      std::ios_base::~ios_base(local_140);
                      features._0_8_ = &features.geometryShader;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&features,"Some sample colors were incorrect","");
                      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                           (pointer)&(__return_storage_ptr__->m_description).field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&__return_storage_ptr__->m_description,features._0_8_,
                                 features._8_8_ + features._0_8_);
                      if ((VkBool32 *)features._0_8_ != &features.geometryShader) {
                        operator_delete((void *)features._0_8_,features._16_8_ + 1);
                      }
                      goto LAB_00756b59;
                    }
                    piVar18 = piVar18 + 1;
                    iVar24 = iVar24 + 1;
                  } while (imageSize.m_data[0] != iVar24);
                }
                iVar27 = iVar27 + 1;
                bVar23 = iVar27 < imageSize.m_data[1];
              } while (iVar27 != imageSize.m_data[1]);
            }
LAB_00756b59:
            if (bVar23) goto LAB_00756be6;
            iVar26 = iVar26 + 1;
          } while (iVar26 < imageSize.m_data[2]);
        }
        features._0_8_ = &features.geometryShader;
        std::__cxx11::string::_M_construct<char_const*>((string *)&features,"OK","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,features._0_8_,
                   features._8_8_ + features._0_8_);
        if ((VkBool32 *)features._0_8_ != &features.geometryShader) {
          operator_delete((void *)features._0_8_,features._16_8_ + 1);
        }
LAB_00756be6:
        if (CONCAT44(VStack_564,local_568) != 0) {
          features._0_8_ = CONCAT44(VStack_564,local_568);
          (**(code **)(*(long *)CONCAT44(VStack_55c,VStack_560) + 0x240))
                    ((long *)CONCAT44(VStack_55c,VStack_560),_local_558,_VStack_550,1);
        }
        if (local_1f8.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                    (&DStack_1f0,local_1f8);
        }
        if (pipelineLayout != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                    (&DStack_2b0,(VkPipelineLayout)pipelineLayout);
        }
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ::~vector(&allChecksumImageViews);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ::~vector(&allMultisampledImageViews);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ::~vector(&allDescriptorSets);
        if (local_1d8.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                    (&DStack_1d0,local_1d8);
        }
        if (descriptorSetLayout != (undefined1  [8])0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                    (&DStack_270,(VkDescriptorSetLayout)descriptorSetLayout);
        }
        de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
                  (&resultBuffer.
                    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>);
        de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
                  (&constantsBuffer.
                    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>);
        de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
                  (&checksumImage.
                    super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
        de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
                  (&msImage.
                    super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
        return __return_storage_ptr__;
      }
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Requested sample count is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
                 ,0xc3);
    }
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const InstanceInterface&	vki					= context.getInstanceInterface();
	const VkPhysicalDevice		physDevice			= context.getPhysicalDevice();
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const VkDevice				device				= context.getDevice();
	const VkQueue				queue				= context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&					allocator			= context.getDefaultAllocator();

	checkRequirements(vki, physDevice, caseDef);

	// Images

	const UniquePtr<Image> msImage(new Image(
		vk, device, allocator, makeImageCreateInfo(caseDef.texture, caseDef.format, VK_IMAGE_USAGE_STORAGE_BIT, 0u), MemoryRequirement::Any));

	const UniquePtr<Image> checksumImage(new Image(
		vk, device, allocator,
		makeImageCreateInfo(Texture(caseDef.texture, 1), CHECKSUM_IMAGE_FORMAT, VK_IMAGE_USAGE_STORAGE_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 0u),
		MemoryRequirement::Any));

	// Buffer used to pass constants to the shader.

	const int			numLayers					= caseDef.texture.numLayers();
	const VkDeviceSize	bufferChunkSize				= getOptimalUniformBufferChunkSize(vki, physDevice, sizeof(deInt32));
	const VkDeviceSize	constantsBufferSizeBytes	= numLayers * bufferChunkSize;
	UniquePtr<Buffer>	constantsBuffer				(new Buffer(vk, device, allocator, makeBufferCreateInfo(constantsBufferSizeBytes, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT),
													 MemoryRequirement::HostVisible));

	{
		const Allocation&	alloc	= constantsBuffer->getAllocation();
		deUint8* const		basePtr = static_cast<deUint8*>(alloc.getHostPtr());

		deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(constantsBufferSizeBytes));

		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			deInt32* const valuePtr = reinterpret_cast<deInt32*>(basePtr + layerNdx * bufferChunkSize);
			*valuePtr = layerNdx;
		}

		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), constantsBufferSizeBytes);
	}

	const VkDeviceSize	resultBufferSizeBytes	= getImageSizeBytes(caseDef.texture.size(), CHECKSUM_IMAGE_FORMAT);
	UniquePtr<Buffer>	resultBuffer			(new Buffer(vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT),
												 MemoryRequirement::HostVisible));

	{
		const Allocation& alloc = resultBuffer->getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Descriptors

	Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers));

	std::vector<SharedVkDescriptorSet>	allDescriptorSets;
	std::vector<SharedVkImageView>		allMultisampledImageViews;
	std::vector<SharedVkImageView>		allChecksumImageViews;

	insertDescriptorSets(vk, device, caseDef, *descriptorPool, *descriptorSetLayout, &allDescriptorSets);
	insertImageViews	(vk, device, caseDef, caseDef.format, **msImage, &allMultisampledImageViews);
	insertImageViews	(vk, device, caseDef, CHECKSUM_IMAGE_FORMAT, **checksumImage, &allChecksumImageViews);

	// Prepare commands

	const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const tcu::IVec3				workSize				= (caseDef.singleLayerBind ? caseDef.texture.layerSize() : caseDef.texture.size());
	const int						loopNumLayers			= (caseDef.singleLayerBind ? numLayers : 1);
	const VkImageSubresourceRange	subresourceAllLayers	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, caseDef.texture.numLayers());

	// Pass 1: Write MS image
	{
		const Unique<VkShaderModule>	shaderModule	(createShaderModule	(vk, device, context.getBinaryCollection().get("comp_store"), 0));
		const Unique<VkPipeline>		pipeline		(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		beginCommandBuffer(vk, *cmdBuffer);
		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier((VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL, **msImage, subresourceAllLayers),
				makeImageMemoryBarrier((VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL, **checksumImage, subresourceAllLayers),
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		for (int layerNdx = 0; layerNdx < loopNumLayers; ++layerNdx)
		{
			const VkDescriptorSet			descriptorSet					= **allDescriptorSets[layerNdx];
			const VkDescriptorImageInfo		descriptorMultiImageInfo		= makeDescriptorImageInfo(DE_NULL, **allMultisampledImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorBufferInfo	descriptorConstantsBufferInfo	= makeDescriptorBufferInfo(constantsBuffer->get(), layerNdx*bufferChunkSize, bufferChunkSize);

			DescriptorSetUpdateBuilder()
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptorConstantsBufferInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorMultiImageInfo)
				.update(vk, device);

			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
			vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), workSize.z());
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Pass 2: "Resolve" MS image in compute shader
	{
		const Unique<VkShaderModule>	shaderModule	(createShaderModule	(vk, device, context.getBinaryCollection().get("comp_load"), 0));
		const Unique<VkPipeline>		pipeline		(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		beginCommandBuffer(vk, *cmdBuffer);
		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_GENERAL, **msImage, subresourceAllLayers),
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		for (int layerNdx = 0; layerNdx < loopNumLayers; ++layerNdx)
		{
			const VkDescriptorSet			descriptorSet					= **allDescriptorSets[layerNdx];
			const VkDescriptorImageInfo		descriptorMultiImageInfo		= makeDescriptorImageInfo(DE_NULL, **allMultisampledImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorImageInfo		descriptorChecksumImageInfo		= makeDescriptorImageInfo(DE_NULL, **allChecksumImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorBufferInfo	descriptorConstantsBufferInfo	= makeDescriptorBufferInfo(constantsBuffer->get(), layerNdx*bufferChunkSize, bufferChunkSize);

			DescriptorSetUpdateBuilder()
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptorConstantsBufferInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorMultiImageInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(2u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorChecksumImageInfo)
				.update(vk, device);

			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
			vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), workSize.z());
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Retrieve result
	{
		beginCommandBuffer(vk, *cmdBuffer);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT, VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **checksumImage, subresourceAllLayers),
			};
			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		{
			const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(caseDef.texture.layerSize()), caseDef.texture.numLayers());
			vk.cmdCopyImageToBuffer(*cmdBuffer, **checksumImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **resultBuffer, 1u, &copyRegion);
		}
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, **resultBuffer, 0ull, resultBufferSizeBytes),
			};
			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify
	{
		const Allocation& alloc = resultBuffer->getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);

		const IVec3		imageSize			= caseDef.texture.size();
		const deInt32*	pDataPtr			= static_cast<deInt32*>(alloc.getHostPtr());
		const deInt32	expectedChecksum	= caseDef.texture.numSamples();

		for (int layer = 0; layer < imageSize.z(); ++layer)
		for (int y = 0; y < imageSize.y(); ++y)
		for (int x = 0; x < imageSize.x(); ++x)
		{
			if (*pDataPtr != expectedChecksum)
			{
				context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Some sample colors were incorrect at (x, y, layer) = (" << x << ", " << y << ", " << layer << ")"	<< tcu::TestLog::EndMessage
					<< tcu::TestLog::Message << "Checksum value is " << *pDataPtr << " but expected " << expectedChecksum << tcu::TestLog::EndMessage;

				return tcu::TestStatus::fail("Some sample colors were incorrect");
			}
			++pDataPtr;
		}

		return tcu::TestStatus::pass("OK");
	}
}